

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleToolButton::child(QAccessibleToolButton *this,int index)

{
  QMenu *pQVar1;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  int in_ESI;
  QToolButton *in_stack_ffffffffffffffd8;
  
  if (in_ESI == 0) {
    toolButton((QAccessibleToolButton *)0x7eea7c);
    pQVar1 = QToolButton::menu(in_stack_ffffffffffffffd8);
    if (pQVar1 != (QMenu *)0x0) {
      toolButton((QAccessibleToolButton *)0x7eea94);
      pQVar2 = (QObject *)QToolButton::menu(in_stack_ffffffffffffffd8);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleToolButton::child(int index) const
{
#if QT_CONFIG(menu)
    if (index == 0 && toolButton()->menu())
    {
        return QAccessible::queryAccessibleInterface(toolButton()->menu());
    }
#else
    Q_UNUSED(index);
#endif
    return nullptr;
}